

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O3

int anon_unknown.dwarf_747f::RtMidi_openport(lua_State *L)

{
  int iVar1;
  RtMidi *pRVar2;
  long *local_48 [2];
  long local_38 [2];
  
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidi");
  pRVar2 = luaGetUserdata<RtMidi>(L,1,"RtMidi");
  iVar1 = luaL_optinteger(L,2,1);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"RtMidi","");
  (**pRVar2->_vptr_RtMidi)(pRVar2,(ulong)(iVar1 - 1),local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return 0;
}

Assistant:

int RtMidi_openport(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	self.openPort(static_cast<unsigned>(luaL_optinteger(L, 2, 1)) - 1);
	return 0;
}